

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fraClaus.c
# Opt level: O0

void Fra_ClausSimInfoClean(Clu_Man_t *p)

{
  int iVar1;
  int iVar2;
  Clu_Man_t *p_local;
  
  iVar1 = p->pCnf->nVars;
  iVar2 = Vec_PtrSize(p->vCexes);
  if (iVar1 <= iVar2) {
    Vec_PtrCleanSimInfo(p->vCexes,0,p->nCexesAlloc / 0x20);
    p->nCexes = 0;
    return;
  }
  __assert_fail("p->pCnf->nVars <= Vec_PtrSize(p->vCexes)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/proof/fra/fraClaus.c"
                ,0x3e1,"void Fra_ClausSimInfoClean(Clu_Man_t *)");
}

Assistant:

void Fra_ClausSimInfoClean( Clu_Man_t * p )
{
    assert( p->pCnf->nVars <= Vec_PtrSize(p->vCexes) );
    Vec_PtrCleanSimInfo( p->vCexes, 0, p->nCexesAlloc/32 );
    p->nCexes = 0;
}